

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_arkstep.c
# Opt level: O2

int arkStep_ComputeState(ARKodeMem ark_mem,N_Vector zcor,N_Vector z)

{
  int iVar1;
  ARKodeARKStepMem step_mem;
  ARKodeARKStepMem local_20;
  
  iVar1 = arkStep_AccessStepMem(ark_mem,"arkStep_ComputeState",&local_20);
  if (iVar1 == 0) {
    N_VLinearSum(0x3ff0000000000000,0,local_20->zpred,zcor,z);
  }
  return iVar1;
}

Assistant:

int arkStep_ComputeState(ARKodeMem ark_mem, N_Vector zcor, N_Vector z)
{
  int retval;
  ARKodeARKStepMem step_mem;

  /* access ARKodeARKStepMem structure */
  retval = arkStep_AccessStepMem(ark_mem, __func__, &step_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  N_VLinearSum(ONE, step_mem->zpred, ONE, zcor, z);

  return (ARK_SUCCESS);
}